

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

ExecutionModel stage_to_execution_model(string *stage)

{
  bool bVar1;
  ExecutionModel EVar2;
  CompilerError *this;
  allocator local_39;
  string local_38;
  
  bVar1 = std::operator==(stage,"vert");
  EVar2 = ExecutionModelVertex;
  if (!bVar1) {
    bVar1 = std::operator==(stage,"frag");
    if (bVar1) {
      EVar2 = ExecutionModelFragment;
    }
    else {
      bVar1 = std::operator==(stage,"comp");
      if (bVar1) {
        EVar2 = ExecutionModelGLCompute;
      }
      else {
        bVar1 = std::operator==(stage,"tesc");
        if (bVar1) {
          EVar2 = ExecutionModelTessellationControl;
        }
        else {
          bVar1 = std::operator==(stage,"tese");
          if (bVar1) {
            EVar2 = ExecutionModelTessellationEvaluation;
          }
          else {
            bVar1 = std::operator==(stage,"geom");
            if (!bVar1) {
              this = (CompilerError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string((string *)&local_38,"Invalid stage.",&local_39);
              spirv_cross::CompilerError::CompilerError(this,&local_38);
              __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                          std::runtime_error::~runtime_error);
            }
            EVar2 = ExecutionModelGeometry;
          }
        }
      }
    }
  }
  return EVar2;
}

Assistant:

static ExecutionModel stage_to_execution_model(const std::string &stage)
{
	if (stage == "vert")
		return ExecutionModelVertex;
	else if (stage == "frag")
		return ExecutionModelFragment;
	else if (stage == "comp")
		return ExecutionModelGLCompute;
	else if (stage == "tesc")
		return ExecutionModelTessellationControl;
	else if (stage == "tese")
		return ExecutionModelTessellationEvaluation;
	else if (stage == "geom")
		return ExecutionModelGeometry;
	else
		SPIRV_CROSS_THROW("Invalid stage.");
}